

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

void __thiscall
pbrt::Image::Image(Image *this,
                  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *p16c,
                  Point2i resolution,
                  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  channels)

{
  bool bVar1;
  int iVar2;
  iterator args_2;
  iterator args_3;
  size_t sVar3;
  int *piVar4;
  undefined8 in_RDX;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *in_RSI;
  PixelFormat *in_RDI;
  int vb;
  size_t va;
  nullptr_t in_stack_fffffffffffffef8;
  polymorphic_allocator<float> *in_stack_ffffffffffffff00;
  polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff20;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *this_00;
  polymorphic_allocator<float> *alloc;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *this_01;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *this_02;
  polymorphic_allocator<unsigned_char> *alloc_00;
  LogLevel level;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_03;
  LogLevel level_00;
  char (*args_4) [44];
  polymorphic_allocator<float> local_50;
  polymorphic_allocator<unsigned_char> local_48 [3];
  char local_30 [24];
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  Tuple2<pbrt::Point2,_int> local_8;
  
  *in_RDI = Half;
  *(undefined8 *)(in_RDI + 1) = in_RDX;
  this_03 = &local_18;
  args_2 = pstd::
           span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::begin(this_03);
  args_3 = pstd::
           span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::end(this_03);
  level_00 = (LogLevel)((ulong)this_03 >> 0x20);
  args_4 = (char (*) [44])local_30;
  pstd::pmr::
  polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::polymorphic_allocator
            ((polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_ffffffffffffff00);
  InlinedVector<std::__cxx11::string,4,pstd::pmr::polymorphic_allocator<std::__cxx11::string>>::
  InlinedVector<std::__cxx11::string_const*>
            (in_stack_ffffffffffffff20,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),in_stack_ffffffffffffff10
             ,in_stack_ffffffffffffff08);
  ColorEncodingHandle::TaggedPointer
            ((ColorEncodingHandle *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  this_02 = (vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
            (in_RDI + 0x2e);
  alloc_00 = local_48;
  pstd::pmr::polymorphic_allocator<unsigned_char>::polymorphic_allocator
            ((polymorphic_allocator<unsigned_char> *)in_stack_ffffffffffffff00);
  pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::vector
            (this_02,alloc_00);
  level = (LogLevel)((ulong)alloc_00 >> 0x20);
  this_01 = (vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)(in_RDI + 0x36);
  pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::vector(this_01,in_RSI);
  this_00 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)(in_RDI + 0x3e);
  alloc = &local_50;
  pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator(in_stack_ffffffffffffff00);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector(this_00,alloc);
  sVar3 = pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::size
                    ((vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)
                     (in_RDI + 0x36));
  iVar2 = NChannels((Image *)0x550555);
  piVar4 = Tuple2<pbrt::Point2,_int>::operator[](&local_8,0);
  iVar2 = iVar2 * *piVar4;
  piVar4 = Tuple2<pbrt::Point2,_int>::operator[](&local_8,1);
  if (sVar3 != (long)(iVar2 * *piVar4)) {
    LogFatal<char_const(&)[11],char_const(&)[44],char_const(&)[11],unsigned_long&,char_const(&)[44],int&>
              (level_00,(char *)in_RSI,level,(char *)this_02,(char (*) [11])this_01,
               (char (*) [44])alloc,(char (*) [11])args_2,(unsigned_long *)args_3,args_4,
               (int *)in_RDI);
  }
  bVar1 = Is16Bit(*in_RDI);
  if (!bVar1) {
    LogFatal<char_const(&)[16]>
              (level,(char *)this_02,(int)((ulong)this_01 >> 0x20),(char *)alloc,
               (char (*) [16])this_00);
  }
  return;
}

Assistant:

Image::Image(pstd::vector<Half> p16c, Point2i resolution,
             pstd::span<const std::string> channels)
    : format(PixelFormat::Half),
      resolution(resolution),
      channelNames(channels.begin(), channels.end()),
      p16(std::move(p16c)) {
    CHECK_EQ(p16.size(), NChannels() * resolution[0] * resolution[1]);
    CHECK(Is16Bit(format));
}